

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psrlh_mips64(uint64_t fs,uint64_t ft)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  uint uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  
  uVar4 = (uint)ft & 0x7f;
  if (0xf < uVar4) {
    return 0;
  }
  auVar1._8_4_ = 0;
  auVar1._0_8_ = fs;
  auVar1._12_2_ = (short)(fs >> 0x30);
  auVar2._8_2_ = (short)(fs >> 0x20);
  auVar2._0_8_ = fs;
  auVar2._10_4_ = auVar1._10_4_;
  auVar3._6_8_ = 0;
  auVar3._0_6_ = auVar2._8_6_;
  uVar6 = (ulong)uVar4;
  auVar5._2_2_ = 0;
  auVar5._0_2_ = (ushort)fs >> uVar6;
  auVar5._4_4_ = (uint)CONCAT82(SUB148(auVar3 << 0x40,6),(short)(fs >> 0x10)) >> uVar6;
  auVar5._8_4_ = auVar2._8_4_ >> uVar6;
  auVar5._12_4_ = (auVar1._10_4_ >> 0x10) >> uVar6;
  auVar5 = pshuflw(auVar5,auVar5,0xe8);
  auVar5 = pshufhw(auVar5,auVar5,0xe8);
  return CONCAT44(auVar5._8_4_,auVar5._0_4_);
}

Assistant:

uint64_t helper_psrlh(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 15) {
        return 0;
    }
    vs.d = fs;
    for (i = 0; i < 4; ++i) {
        vs.uh[i] >>= ft;
    }
    return vs.d;
}